

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handshake_util.cc
# Opt level: O2

bool __thiscall ScopedProcess::Wait(ScopedProcess *this,int *out_status)

{
  __pid_t __pid;
  __pid_t _Var1;
  int *piVar2;
  
  __pid = this->pid_;
  if (-1 < __pid) {
    do {
      _Var1 = waitpid(__pid,out_status,0);
      if (-1 < _Var1) break;
      piVar2 = __errno_location();
    } while (*piVar2 == 4);
    if (_Var1 == this->pid_) {
      this->pid_ = -1;
      return true;
    }
  }
  return false;
}

Assistant:

bool Wait(int *out_status) {
    if (pid_ < 0) {
      return false;
    }
    if (waitpid_eintr(pid_, out_status, 0) != pid_) {
      return false;
    }
    pid_ = -1;
    return true;
  }